

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_index.h
# Opt level: O3

void __thiscall BufferIndex<double,_long>::index_size(BufferIndex<double,_long> *this)

{
  size_type sVar1;
  leaf_node *plVar2;
  size_t sVar3;
  leaf_node *plVar4;
  leaf_node *plVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  unsigned_short uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZMM0 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar14 [16];
  
  auVar13 = in_ZMM0._0_16_;
  sVar1 = (this->btree).m_stats.leaves;
  lVar7 = sVar1 * 0x10 + ((this->btree).m_stats.innernodes + sVar1) * 0x100 + 0x58;
  lVar11 = ((this->right_buffer).number + (this->left_buffer).number) * 0x10;
  plVar5 = (this->btree).m_headleaf;
  plVar2 = (this->btree).m_tailleaf;
  lVar12 = 0x10000;
  uVar8 = 0;
  while( true ) {
    if (plVar2 == (leaf_node *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (plVar2->super_node).slotuse;
    }
    if ((plVar2 == plVar5) && ((unsigned_short)uVar8 == uVar9)) break;
    sVar3 = plVar5->slotdata[uVar8]->size;
    lVar12 = lVar12 + sVar3 * 0x10 + 0x8000;
    lVar11 = lVar11 + (sVar3 + (plVar5->slotdata[uVar8]->buffer).number) * 0x10;
    uVar10 = (uint)(plVar5->super_node).slotuse;
    if ((int)uVar8 + 1U < uVar10) {
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x30;
    }
    else {
      plVar4 = plVar5->nextleaf;
      if (plVar4 != (leaf_node *)0x0) {
        plVar5 = plVar4;
      }
      uVar8 = (ulong)uVar10;
      if (plVar4 != (leaf_node *)0x0) {
        uVar8 = 0;
      }
      lVar7 = lVar7 + 0x30;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total size: ",0xc);
  auVar13 = vcvtusi2sd_avx512f(auVar13,lVar7 + lVar12);
  poVar6 = std::ostream::_M_insert<double>(auVar13._0_8_ * 9.5367431640625e-07);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," MB",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  auVar15._8_56_ = extraout_var;
  auVar15._0_8_ = extraout_XMM1_Qa;
  auVar13 = auVar15._0_16_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Model size: ",0xc);
  auVar13 = vcvtusi2sd_avx512f(auVar13,lVar7);
  poVar6 = std::ostream::_M_insert<double>(auVar13._0_8_ * 9.5367431640625e-07);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," MB",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  auVar16._8_56_ = extraout_var_00;
  auVar16._0_8_ = extraout_XMM1_Qa_00;
  auVar14 = auVar16._0_16_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Fill rate: ",0xb);
  auVar13 = vcvtusi2sd_avx512f(auVar14,lVar11);
  auVar14 = vcvtusi2sd_avx512f(auVar14,lVar12);
  poVar6 = std::ostream::_M_insert<double>((auVar13._0_8_ * 100.0) / auVar14._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"%",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

void index_size() const {
        size_t model_size = 0;
        size_t slot_size = 0;
        size_t data_size = 0;
        model_size += sizeof(*this) - 2 * RESERVE * (sizeof(K) + sizeof(P)) + (btree.get_stats().innernodes * btree.get_stats().innerslots + btree.get_stats().leaves * btree.get_stats().leafslots) * (sizeof(K) + sizeof(void*)) + btree.get_stats().leaves * sizeof(void*) * 2;
        slot_size += 2 * RESERVE * (sizeof(K) + sizeof(P));
        data_size += (left_buffer.number + right_buffer.number) * (sizeof(K) + sizeof(P));
        auto it = btree.begin();
        while (it != btree.end()) {
            it->second->node_size(model_size, slot_size, data_size);
            it++;
        }

        std::cout << "Total size: " << (double)(model_size+slot_size)/(1024*1024) << " MB" << std::endl;
        std::cout << "Model size: " << (double)model_size/(1024*1024) << " MB" << std::endl;
        std::cout << "Fill rate: " << (double)100*data_size/slot_size << "%" << std::endl;
    }